

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlEntityPtr xmlLookupGeneralEntity(xmlParserCtxtPtr ctxt,xmlChar *name,int inAttr)

{
  xmlParserCtxtPtr local_30;
  xmlEntityPtr ent;
  int inAttr_local;
  xmlChar *name_local;
  xmlParserCtxtPtr ctxt_local;
  
  local_30 = (xmlParserCtxtPtr)0x0;
  if (((ctxt->options & 0x100000U) != 0) ||
     (local_30 = (xmlParserCtxtPtr)xmlGetPredefinedEntity(name), ctxt_local = local_30,
     local_30 == (xmlParserCtxtPtr)0x0)) {
    if (ctxt->sax != (_xmlSAXHandler *)0x0) {
      if (ctxt->sax->getEntity != (getEntitySAXFunc)0x0) {
        local_30 = (xmlParserCtxtPtr)(*ctxt->sax->getEntity)(ctxt->userData,name);
      }
      if (((ctxt->wellFormed == 1) && (local_30 == (xmlParserCtxtPtr)0x0)) &&
         ((ctxt->options & 0x100000U) != 0)) {
        local_30 = (xmlParserCtxtPtr)xmlGetPredefinedEntity(name);
      }
      if (((ctxt->wellFormed == 1) && (local_30 == (xmlParserCtxtPtr)0x0)) &&
         ((xmlParserCtxtPtr)ctxt->userData == ctxt)) {
        local_30 = (xmlParserCtxtPtr)xmlSAX2GetEntity(ctxt,name);
      }
    }
    if (local_30 == (xmlParserCtxtPtr)0x0) {
      xmlHandleUndeclaredEntity(ctxt,name);
    }
    else if (local_30->nodeMax == XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
      xmlFatalErrMsgStr(ctxt,XML_ERR_UNPARSED_ENTITY,"Entity reference to unparsed entity %s\n",name
                       );
      local_30 = (xmlParserCtxtPtr)0x0;
    }
    else if ((local_30->nodeMax == XML_EXTERNAL_GENERAL_PARSED_ENTITY) && (inAttr != 0)) {
      xmlFatalErrMsgStr(ctxt,XML_ERR_ENTITY_IS_EXTERNAL,
                        "Attribute references external entity \'%s\'\n",name);
      local_30 = (xmlParserCtxtPtr)0x0;
    }
    ctxt_local = local_30;
  }
  return (xmlEntityPtr)ctxt_local;
}

Assistant:

static xmlEntityPtr
xmlLookupGeneralEntity(xmlParserCtxtPtr ctxt, const xmlChar *name, int inAttr) {
    xmlEntityPtr ent = NULL;

    /*
     * Predefined entities override any extra definition
     */
    if ((ctxt->options & XML_PARSE_OLDSAX) == 0) {
        ent = xmlGetPredefinedEntity(name);
        if (ent != NULL)
            return(ent);
    }

    /*
     * Ask first SAX for entity resolution, otherwise try the
     * entities which may have stored in the parser context.
     */
    if (ctxt->sax != NULL) {
	if (ctxt->sax->getEntity != NULL)
	    ent = ctxt->sax->getEntity(ctxt->userData, name);
	if ((ctxt->wellFormed == 1 ) && (ent == NULL) &&
	    (ctxt->options & XML_PARSE_OLDSAX))
	    ent = xmlGetPredefinedEntity(name);
	if ((ctxt->wellFormed == 1 ) && (ent == NULL) &&
	    (ctxt->userData==ctxt)) {
	    ent = xmlSAX2GetEntity(ctxt, name);
	}
    }

    if (ent == NULL) {
        xmlHandleUndeclaredEntity(ctxt, name);
    }

    /*
     * [ WFC: Parsed Entity ]
     * An entity reference must not contain the name of an
     * unparsed entity
     */
    else if (ent->etype == XML_EXTERNAL_GENERAL_UNPARSED_ENTITY) {
	xmlFatalErrMsgStr(ctxt, XML_ERR_UNPARSED_ENTITY,
		 "Entity reference to unparsed entity %s\n", name);
        ent = NULL;
    }

    /*
     * [ WFC: No External Entity References ]
     * Attribute values cannot contain direct or indirect
     * entity references to external entities.
     */
    else if (ent->etype == XML_EXTERNAL_GENERAL_PARSED_ENTITY) {
        if (inAttr) {
            xmlFatalErrMsgStr(ctxt, XML_ERR_ENTITY_IS_EXTERNAL,
                 "Attribute references external entity '%s'\n", name);
            ent = NULL;
        }
    }

    return(ent);
}